

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystemCommand.cpp
# Opt level: O1

void anon_unknown.dwarf_39292::buildUsage(int exitCode)

{
  FILE *__stream;
  char *pcVar1;
  raw_ostream *os;
  
  __stream = _stderr;
  pcVar1 = llbuild::commands::getProgramName();
  fprintf(__stream,"Usage: %s buildsystem build [options] [<target>]\n",pcVar1);
  fwrite("\nOptions:\n",10,1,_stderr);
  os = llvm::errs();
  llbuild::buildsystem::BuildSystemInvocation::getUsage(0x19,os);
  exit(exitCode);
}

Assistant:

static void buildUsage(int exitCode) {
  int optionWidth = 25;
  fprintf(stderr, "Usage: %s buildsystem build [options] [<target>]\n",
          getProgramName());
  fprintf(stderr, "\nOptions:\n");
  BuildSystemInvocation::getUsage(optionWidth, llvm::errs());
  ::exit(exitCode);
}